

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O3

void __thiscall gui::MenuBar::handleMouseLeft(MenuBar *this)

{
  pointer pMVar1;
  bool bVar2;
  
  bVar2 = this->menuIsOpen_ == false;
  if (bVar2) {
    if ((bVar2) && (this->selectedMenu_ == -1)) goto LAB_0014182d;
    this->selectedMenu_ = -1;
    this->menuIsOpen_ = false;
  }
  else {
    pMVar1 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pMVar1[this->selectedMenu_].selectedItem_ == -1) goto LAB_0014182d;
    pMVar1[this->selectedMenu_].selectedItem_ = -1;
  }
  Widget::requestRedraw(&this->super_Widget);
LAB_0014182d:
  Widget::handleMouseLeft(&this->super_Widget);
  return;
}

Assistant:

void MenuBar::handleMouseLeft() {
    if (!menuIsOpen_) {
        selectMenu(-1, false);
    } else {
        selectMenuItem(-1);
    }
    baseClass::handleMouseLeft();
}